

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::Int64Vector::_internal_add_vector(Int64Vector *this,int64_t value)

{
  RepeatedField<long> *this_00;
  uint uVar1;
  long *plVar2;
  long tmp;
  
  this_00 = &this->vector_;
  uVar1 = (this->vector_).current_size_;
  if (uVar1 == (this->vector_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this_00,uVar1 + 1);
    plVar2 = google::protobuf::RepeatedField<long>::elements(this_00);
    plVar2[uVar1] = value;
  }
  else {
    plVar2 = google::protobuf::RepeatedField<long>::elements(this_00);
    plVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void Int64Vector::_internal_add_vector(int64_t value) {
  vector_.Add(value);
}